

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t ctrl_set_external_partition(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  long lVar1;
  aom_ext_part_funcs_t funcs_00;
  aom_codec_err_t aVar2;
  undefined8 *puVar3;
  uint *in_RSI;
  long in_RDI;
  aom_codec_err_t status;
  aom_ext_part_config_t config;
  aom_ext_part_funcs_t funcs;
  AV1_COMP *cpi;
  undefined4 in_stack_ffffffffffffffa0;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffa8;
  void *in_stack_ffffffffffffffb0;
  ExtPartController *local_40;
  aom_ext_part_config_t aStack_38;
  undefined8 uStack_28;
  undefined8 local_20;
  
  lVar1 = *(long *)(*(long *)(in_RDI + 0xb50) + 0x160);
  uVar4 = *in_RSI;
  if (uVar4 < 0x29) {
    puVar3 = (undefined8 *)((long)(int)uVar4 + *(long *)(in_RSI + 4));
    *in_RSI = uVar4 + 8;
  }
  else {
    puVar3 = *(undefined8 **)(in_RSI + 2);
    *(undefined8 **)(in_RSI + 2) = puVar3 + 1;
  }
  memcpy(&stack0xffffffffffffffb0,(void *)*puVar3,0x38);
  funcs_00.send_features = (aom_ext_part_send_features_fn_t)local_20;
  funcs_00.create_model = (aom_ext_part_create_model_fn_t)uStack_28;
  funcs_00.get_partition_decision = (aom_ext_part_get_decision_fn_t)puVar3;
  funcs_00.send_partition_stats = (aom_ext_part_send_partition_stats_fn_t)in_RSI;
  funcs_00.delete_model._0_4_ = in_stack_ffffffffffffffa0;
  funcs_00.delete_model._4_4_ = uVar4;
  funcs_00.decision_mode = in_stack_ffffffffffffffa8;
  funcs_00._44_1_ = *(undefined1 *)(*(long *)(lVar1 + 0x42008) + 0x1c);
  funcs_00._45_3_ = 0;
  funcs_00.priv = in_stack_ffffffffffffffb0;
  aVar2 = av1_ext_part_create(funcs_00,aStack_38,local_40);
  return aVar2;
}

Assistant:

static aom_codec_err_t ctrl_set_external_partition(aom_codec_alg_priv_t *ctx,
                                                   va_list args) {
  AV1_COMP *const cpi = ctx->ppi->cpi;
  aom_ext_part_funcs_t funcs = *CAST(AV1E_SET_EXTERNAL_PARTITION, args);
  aom_ext_part_config_t config;
  // TODO(chengchen): verify the sb_size has been set at this point.
  config.superblock_size = cpi->common.seq_params->sb_size;
  const aom_codec_err_t status =
      av1_ext_part_create(funcs, config, &cpi->ext_part_controller);
  return status;
}